

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HArray.hpp
# Opt level: O0

Value<char16_t> * __thiscall
Qentem::HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>::GetValue
          (HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *this,Char_T *key,SizeT length
          )

{
  SizeT hash;
  Value<char16_t> *pVVar1;
  SizeT length_local;
  Char_T *key_local;
  HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *this_local;
  
  hash = StringUtils::Hash<char16_t>(key,length);
  pVVar1 = GetValue(this,key,length,hash);
  return pVVar1;
}

Assistant:

Value_T *GetValue(const Char_T *key, const SizeT length) const noexcept {
        return GetValue(key, length, StringUtils::Hash(key, length));
    }